

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void mbedtls_debug_printf_ecdh
               (mbedtls_ssl_context *ssl,int level,char *file,int line,mbedtls_ecdh_context *ecdh,
               mbedtls_debug_ecdh_attr attr)

{
  mbedtls_debug_ecdh_attr attr_local;
  mbedtls_ecdh_context *ecdh_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_printf_ecdh_internal(ssl,level,file,line,ecdh,attr);
  return;
}

Assistant:

void mbedtls_debug_printf_ecdh(const mbedtls_ssl_context *ssl, int level,
                               const char *file, int line,
                               const mbedtls_ecdh_context *ecdh,
                               mbedtls_debug_ecdh_attr attr)
{
#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    mbedtls_debug_printf_ecdh_internal(ssl, level, file, line, ecdh, attr);
#else
    switch (ecdh->var) {
        default:
            mbedtls_debug_printf_ecdh_internal(ssl, level, file, line, ecdh,
                                               attr);
    }
#endif
}